

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMem.c
# Opt level: O2

Fraig_MemFixed_t * Fraig_MemFixedStart(int nEntrySize)

{
  Fraig_MemFixed_t *pFVar1;
  char **ppcVar2;
  uint uVar3;
  
  pFVar1 = (Fraig_MemFixed_t *)calloc(1,0x38);
  pFVar1->nEntrySize = nEntrySize;
  uVar3 = 0x400;
  if (0x3f < nEntrySize) {
    uVar3 = 8;
    if (8 < 0x10000U / (uint)nEntrySize) {
      uVar3 = 0x10000U / (uint)nEntrySize;
    }
  }
  pFVar1->nChunkSize = uVar3;
  pFVar1->nChunksAlloc = 0x40;
  pFVar1->nChunks = 0;
  ppcVar2 = (char **)malloc(0x200);
  pFVar1->pChunks = ppcVar2;
  pFVar1->nMemoryUsed = 0;
  pFVar1->nMemoryAlloc = 0;
  return pFVar1;
}

Assistant:

Fraig_MemFixed_t * Fraig_MemFixedStart( int nEntrySize )
{
    Fraig_MemFixed_t * p;

    p = ABC_ALLOC( Fraig_MemFixed_t, 1 );
    memset( p, 0, sizeof(Fraig_MemFixed_t) );

    p->nEntrySize    = nEntrySize;
    p->nEntriesAlloc = 0;
    p->nEntriesUsed  = 0;
    p->pEntriesFree  = NULL;

    if ( nEntrySize * (1 << 10) < (1<<16) )
        p->nChunkSize = (1 << 10);
    else
        p->nChunkSize = (1<<16) / nEntrySize;
    if ( p->nChunkSize < 8 )
        p->nChunkSize = 8;

    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );

    p->nMemoryUsed   = 0;
    p->nMemoryAlloc  = 0;
    return p;
}